

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

unsigned_long
AdaptingOutputOnlyProcess
          (PaUtilBufferProcessor *bp,int *streamCallbackResult,
          PaUtilChannelDescriptor *hostOutputChannels,unsigned_long framesToProcess)

{
  unsigned_long uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  unsigned_long local_70;
  unsigned_long local_68;
  unsigned_long framesProcessed;
  unsigned_long framesToGo;
  unsigned_long frameCount;
  uint local_48;
  uint i;
  uint srcChannelStrideBytes;
  uint srcSampleStrideSamples;
  uchar *srcBytePtr;
  void *userOutput;
  void *userInput;
  unsigned_long framesToProcess_local;
  PaUtilChannelDescriptor *hostOutputChannels_local;
  int *streamCallbackResult_local;
  PaUtilBufferProcessor *bp_local;
  
  local_68 = 0;
  framesProcessed = framesToProcess;
  do {
    if ((bp->framesInTempOutputBuffer == 0) && (*streamCallbackResult == 0)) {
      if (bp->userOutputIsInterleaved == 0) {
        for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->outputChannelCount;
            frameCount._4_4_ = frameCount._4_4_ + 1) {
          bp->tempOutputBufferPtrs[frameCount._4_4_] =
               (void *)((long)bp->tempOutputBuffer +
                       (ulong)frameCount._4_4_ * bp->framesPerUserBuffer *
                       (ulong)bp->bytesPerUserOutputSample);
        }
        srcBytePtr = (uchar *)bp->tempOutputBufferPtrs;
      }
      else {
        srcBytePtr = (uchar *)bp->tempOutputBuffer;
      }
      bp->timeInfo->inputBufferAdcTime = 0.0;
      iVar2 = (*bp->streamCallback)
                        ((void *)0x0,srcBytePtr,bp->framesPerUserBuffer,bp->timeInfo,
                         bp->callbackStatusFlags,bp->userData);
      *streamCallbackResult = iVar2;
      if (*streamCallbackResult != 2) {
        uVar1 = bp->framesPerUserBuffer;
        auVar3._8_4_ = (int)(uVar1 >> 0x20);
        auVar3._0_8_ = uVar1;
        auVar3._12_4_ = 0x45300000;
        bp->timeInfo->outputBufferDacTime =
             ((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * bp->samplePeriod +
             bp->timeInfo->outputBufferDacTime;
        bp->framesInTempOutputBuffer = bp->framesPerUserBuffer;
      }
    }
    if (bp->framesInTempOutputBuffer == 0) {
      framesToGo = framesProcessed;
      for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->outputChannelCount;
          frameCount._4_4_ = frameCount._4_4_ + 1) {
        (*bp->outputZeroer)(hostOutputChannels[frameCount._4_4_].data,
                            hostOutputChannels[frameCount._4_4_].stride,(uint)framesProcessed);
        hostOutputChannels[frameCount._4_4_].data =
             (void *)((long)hostOutputChannels[frameCount._4_4_].data +
                     framesProcessed * hostOutputChannels[frameCount._4_4_].stride *
                     (ulong)bp->bytesPerHostOutputSample);
      }
    }
    else {
      if (bp->framesInTempOutputBuffer < framesProcessed) {
        local_70 = bp->framesInTempOutputBuffer;
      }
      else {
        local_70 = framesProcessed;
      }
      framesToGo = local_70;
      if (bp->userOutputIsInterleaved == 0) {
        _srcChannelStrideBytes =
             (void *)((long)bp->tempOutputBuffer +
                     (ulong)bp->bytesPerUserOutputSample *
                     (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer));
        i = 1;
        local_48 = (int)bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
      }
      else {
        _srcChannelStrideBytes =
             (void *)((long)bp->tempOutputBuffer +
                     (ulong)(bp->bytesPerUserOutputSample * bp->outputChannelCount) *
                     (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer));
        i = bp->outputChannelCount;
        local_48 = bp->bytesPerUserOutputSample;
      }
      for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->outputChannelCount;
          frameCount._4_4_ = frameCount._4_4_ + 1) {
        (*bp->outputConverter)
                  (hostOutputChannels[frameCount._4_4_].data,
                   hostOutputChannels[frameCount._4_4_].stride,_srcChannelStrideBytes,i,
                   (uint)local_70,&bp->ditherGenerator);
        _srcChannelStrideBytes = (void *)((long)_srcChannelStrideBytes + (ulong)local_48);
        hostOutputChannels[frameCount._4_4_].data =
             (void *)((long)hostOutputChannels[frameCount._4_4_].data +
                     local_70 * hostOutputChannels[frameCount._4_4_].stride *
                     (ulong)bp->bytesPerHostOutputSample);
      }
      bp->framesInTempOutputBuffer = bp->framesInTempOutputBuffer - local_70;
    }
    local_68 = framesToGo + local_68;
    framesProcessed = framesProcessed - framesToGo;
  } while (framesProcessed != 0);
  return local_68;
}

Assistant:

static unsigned long AdaptingOutputOnlyProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostOutputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *srcBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes;  /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;

    do
    {
        if( bp->framesInTempOutputBuffer == 0 && *streamCallbackResult == paContinue )
        {
            userInput = 0;

            /* setup userOutput */
            if( bp->userOutputIsInterleaved )
            {
                userOutput = bp->tempOutputBuffer;
            }
            else /* user output is not interleaved */
            {
                for( i = 0; i < bp->outputChannelCount; ++i )
                {
                    bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                            i * bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
                }

                userOutput = bp->tempOutputBufferPtrs;
            }

            bp->timeInfo->inputBufferAdcTime = 0;

            *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                    bp->framesPerUserBuffer, bp->timeInfo,
                    bp->callbackStatusFlags, bp->userData );

            if( *streamCallbackResult == paAbort )
            {
                /* if the callback returned paAbort, we disregard its output */
            }
            else
            {
                bp->timeInfo->outputBufferDacTime += bp->framesPerUserBuffer * bp->samplePeriod;

                bp->framesInTempOutputBuffer = bp->framesPerUserBuffer;
            }
        }

        if( bp->framesInTempOutputBuffer > 0 )
        {
            /* convert frameCount frames from user buffer to host buffer */

            frameCount = PA_MIN_( bp->framesInTempOutputBuffer, framesToGo );

            if( bp->userOutputIsInterleaved )
            {
                srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                        bp->bytesPerUserOutputSample * bp->outputChannelCount *
                        (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

                srcSampleStrideSamples = bp->outputChannelCount;
                srcChannelStrideBytes = bp->bytesPerUserOutputSample;
            }
            else /* user output is not interleaved */
            {
                srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                        bp->bytesPerUserOutputSample *
                        (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

                srcSampleStrideSamples = 1;
                srcChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
            }

            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputConverter(    hostOutputChannels[i].data,
                                        hostOutputChannels[i].stride,
                                        srcBytePtr, srcSampleStrideSamples,
                                        frameCount, &bp->ditherGenerator );

                srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }

            bp->framesInTempOutputBuffer -= frameCount;
        }
        else
        {
            /* no more user data is available because the callback has returned
                paComplete or paAbort. Fill the remainder of the host buffer
                with zeros.
            */

            frameCount = framesToGo;

            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputZeroer(   hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    frameCount );

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }
        }

        framesProcessed += frameCount;

        framesToGo -= frameCount;

    }while( framesToGo > 0 );

    return framesProcessed;
}